

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int eval_binop_operands(c2m_ctx_t c2m_ctx,node_t_conflict tree,val *v1,val *v2)

{
  int iVar1;
  node_t tree_00;
  val vVar2;
  
  vVar2 = eval(c2m_ctx,(tree->u).ops.head);
  v1->uns_p = vVar2.uns_p;
  (v1->u).i_val = (mir_llong)vVar2.u;
  tree_00 = (tree->u).ops.head;
  if (tree_00 != (node_t)0x0) {
    tree_00 = (tree_00->op_link).next;
  }
  vVar2 = eval(c2m_ctx,tree_00);
  iVar1 = vVar2.uns_p;
  v2->uns_p = iVar1;
  (v2->u).i_val = (mir_llong)vVar2.u;
  if (((v1->uns_p != 0) && (iVar1 == 0)) || ((v1->uns_p == 0 && (v2 = v1, iVar1 != 0)))) {
    v2->uns_p = 1;
  }
  return v1->uns_p;
}

Assistant:

static int eval_binop_operands (c2m_ctx_t c2m_ctx, node_t tree, struct val *v1, struct val *v2) {
  *v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
  *v2 = eval (c2m_ctx, NL_EL (tree->u.ops, 1));
  if (v1->uns_p && !v2->uns_p) {
    v2->uns_p = TRUE;
    v2->u.u_val = v2->u.i_val;
  } else if (!v1->uns_p && v2->uns_p) {
    v1->uns_p = TRUE;
    v1->u.u_val = v1->u.i_val;
  }
  return v1->uns_p;
}